

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

char * QUtil::getWhoami(char *argv0)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_18;
  char *whoami;
  char *argv0_local;
  
  pcVar2 = strrchr(argv0,0x2f);
  if ((pcVar2 != (char *)0x0) ||
     (pcVar2 = strrchr(argv0,0x5c), local_18 = argv0, pcVar2 != (char *)0x0)) {
    local_18 = pcVar2;
    local_18 = local_18 + 1;
  }
  sVar3 = strlen(local_18);
  if (4 < sVar3) {
    sVar3 = strlen(local_18);
    iVar1 = strcmp(local_18 + (sVar3 - 4),".exe");
    if (iVar1 == 0) {
      sVar3 = strlen(local_18);
      local_18[sVar3 - 4] = '\0';
    }
  }
  return local_18;
}

Assistant:

char*
QUtil::getWhoami(char* argv0)
{
    char* whoami = nullptr;
    if (((whoami = strrchr(argv0, '/')) == nullptr) &&
        ((whoami = strrchr(argv0, '\\')) == nullptr)) {
        whoami = argv0;
    } else {
        ++whoami;
    }

    if ((strlen(whoami) > 4) && (strcmp(whoami + strlen(whoami) - 4, ".exe") == 0)) {
        whoami[strlen(whoami) - 4] = '\0';
    }

    return whoami;
}